

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tostring(lua_State *L)

{
  TValue *pTVar1;
  cTValue *L_00;
  undefined4 *puVar2;
  GCstr *pGVar3;
  long in_RDI;
  cTValue *mo;
  TValue *o;
  undefined8 in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar4;
  lua_State *in_stack_ffffffffffffff68;
  cTValue *in_stack_ffffffffffffff90;
  lua_State *in_stack_ffffffffffffff98;
  
  pTVar1 = lj_lib_checkany(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20)
                          );
  *(TValue **)(in_RDI + 0x18) = pTVar1 + 1;
  L_00 = lj_meta_lookup(in_stack_ffffffffffffff68,
                        (cTValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (MMS)((ulong)in_RDI >> 0x20));
  if ((L_00->field_2).it == 0xffffffff) {
    if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
        *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
      lj_gc_step((lua_State *)&L_00->field_2);
    }
    puVar2 = (undefined4 *)(*(long *)(in_RDI + 0x10) + -8);
    pGVar3 = lj_strfmt_obj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    *puVar2 = (int)pGVar3;
    puVar2[1] = 0xfffffffb;
    iVar4 = 2;
  }
  else {
    ((cTValue *)(*(long *)(in_RDI + 0x10) + -8))->field_2 =
         *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)L_00;
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  }
  lj_gc_check(L);
  setstrV(L, L->base-1-LJ_FR2, lj_strfmt_obj(L, L->base));
  return FFH_RES(1);
}